

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O1

void gen_sriq(DisasContext_conflict10 *ctx)

{
  TCGContext_conflict10 *s;
  TCGTemp *a2;
  TCGTemp *a1;
  uintptr_t o;
  uint uVar1;
  uintptr_t o_2;
  uintptr_t o_1;
  TCGv_i64 ret;
  
  s = ctx->uc->tcg_ctx;
  uVar1 = ctx->opcode >> 0xb & 0x1f;
  a2 = tcg_temp_new_internal_ppc64(s,TCG_TYPE_I64,false);
  ret = (TCGv_i64)((long)a2 - (long)s);
  a1 = tcg_temp_new_internal_ppc64(s,TCG_TYPE_I64,false);
  tcg_gen_shri_i64_ppc64
            (s,ret,*(TCGv_i64 *)((long)cpu_gpr + (ulong)(ctx->opcode >> 0x12 & 0xf8)),(ulong)uVar1);
  tcg_gen_shli_i64_ppc64
            (s,(TCGv_i64)((long)a1 - (long)s),
             *(TCGv_i64 *)((long)cpu_gpr + (ulong)(ctx->opcode >> 0x12 & 0xf8)),
             (ulong)(0x20 - uVar1));
  tcg_gen_op3_ppc64(s,INDEX_op_or_i64,(TCGArg)a1,(TCGArg)a2,(TCGArg)a1);
  if (cpu_gpr[*(ushort *)((long)&ctx->opcode + 2) & 0x1f] != ret) {
    tcg_gen_op2_ppc64(s,INDEX_op_mov_i64,
                      (TCGArg)(cpu_gpr[*(ushort *)((long)&ctx->opcode + 2) & 0x1f] + (long)s),
                      (TCGArg)a2);
  }
  tcg_gen_op3_ppc64(s,INDEX_op_st_i64,(TCGArg)a1,(TCGArg)(s->cpu_env + (long)s),0xb18);
  tcg_temp_free_internal_ppc64(s,(TCGTemp *)(ret + (long)s));
  tcg_temp_free_internal_ppc64(s,(TCGTemp *)((TCGv_i64)((long)a1 - (long)s) + (long)s));
  if ((ctx->opcode & 1) != 0) {
    gen_sriq_cold_1();
  }
  return;
}

Assistant:

static void gen_sriq(DisasContext *ctx)
{
    TCGContext *tcg_ctx = ctx->uc->tcg_ctx;
    int sh = SH(ctx->opcode);
    TCGv t0 = tcg_temp_new(tcg_ctx);
    TCGv t1 = tcg_temp_new(tcg_ctx);
    tcg_gen_shri_tl(tcg_ctx, t0, cpu_gpr[rS(ctx->opcode)], sh);
    tcg_gen_shli_tl(tcg_ctx, t1, cpu_gpr[rS(ctx->opcode)], 32 - sh);
    tcg_gen_or_tl(tcg_ctx, t1, t0, t1);
    tcg_gen_mov_tl(tcg_ctx, cpu_gpr[rA(ctx->opcode)], t0);
    gen_store_spr(tcg_ctx, SPR_MQ, t1);
    tcg_temp_free(tcg_ctx, t0);
    tcg_temp_free(tcg_ctx, t1);
    if (unlikely(Rc(ctx->opcode) != 0)) {
        gen_set_Rc0(ctx, cpu_gpr[rA(ctx->opcode)]);
    }
}